

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O2

void time_compare(int n,char **ps,char *s,char *end)

{
  OnigRegSet *pOVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char **pat;
  ulong uVar5;
  clock_t cVar6;
  clock_t cVar7;
  clock_t cVar8;
  clock_t cVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  char *in_R8;
  ulong uVar13;
  ulong uVar14;
  int match_pos;
  double local_60;
  double local_58;
  char **local_50;
  ulong local_48;
  ulong local_40;
  OnigRegSet *local_38;
  
  uVar13 = (ulong)(uint)n;
  pat = (char **)malloc(uVar13 * 8);
  if (pat != (char **)0x0) {
    uVar10 = 0;
    local_40 = 100 / (ulong)(uint)n;
    iVar11 = 0;
    if (0 < n) {
      iVar11 = n;
    }
    iVar2 = (int)local_40;
    local_58 = 0.0;
    local_60 = 0.0;
    local_50 = ps;
    while ((int)uVar10 != iVar11) {
      for (uVar5 = 0; uVar14 = uVar13, local_48 = uVar10, uVar13 != uVar5; uVar5 = uVar5 + 1) {
        pat[uVar5] = local_50[uVar5];
      }
      for (; 1 < (int)uVar14; uVar14 = uVar14 - 1) {
        iVar3 = rand();
        iVar3 = iVar3 % (int)uVar14;
        pcVar12 = pat[uVar14 - 1];
        pat[uVar14 - 1] = pat[iVar3];
        pat[iVar3] = pcVar12;
      }
      iVar3 = make_regset(0,n,pat,&local_38,(int)in_R8);
      if (iVar3 != 0) {
LAB_001028a4:
        free(pat);
        return;
      }
      cVar6 = clock();
      pOVar1 = local_38;
      iVar3 = -1;
      while( true ) {
        iVar3 = iVar3 + 1;
        if ((int)local_40 == iVar3) break;
        in_R8 = end;
        uVar4 = onig_regset_search(pOVar1,s,end,s,end,0,0,&match_pos);
        if ((int)uVar4 < 0) {
          pcVar12 = "FAIL onig_regset_search(POSITION_LEAD): %d\n";
          goto LAB_00102893;
        }
      }
      cVar7 = clock();
      cVar8 = clock();
      iVar3 = iVar2 + 1;
      while (iVar3 = iVar3 + -1, iVar3 != 0) {
        in_R8 = end;
        uVar4 = onig_regset_search(pOVar1,s,end,s,end,1,0,&match_pos);
        if ((int)uVar4 < 0) {
          pcVar12 = "FAIL onig_regset_search(REGEX_LEAD): %d\n";
LAB_00102893:
          fprintf(_stderr,pcVar12,(ulong)uVar4);
          onig_regset_free(pOVar1);
          goto LAB_001028a4;
        }
      }
      cVar9 = clock();
      onig_regset_free();
      local_58 = local_58 + (double)(cVar7 - cVar6) / 1000000.0;
      local_60 = local_60 + (double)(cVar9 - cVar8) / 1000000.0;
      uVar10 = (ulong)((int)local_48 + 1);
    }
    free(pat);
    fprintf(_stdout,"POS lead: %6.2lfmsec.  REG lead: %6.2lfmsec.\n",local_58 * 1000.0,
            local_60 * 1000.0);
  }
  return;
}

Assistant:

static void
time_compare(int n, char* ps[], char* s, char* end)
{
  int r;
  int i;
  int repeat;
  double t_set, t_reg;
  double total_set, total_reg;
  char** cps;

  cps = (char** )malloc(sizeof(char*) * n);
  if (cps == 0) return ;

  repeat = 100 / n;
  total_set = total_reg = 0.0;
  for (i = 0; i < n; i++) {
    fisher_yates_shuffle(n, ps, cps);
    r = time_test(repeat, n, cps, s, end, &t_set, &t_reg);
    if (r != 0) {
      free(cps);
      return ;
    }
    total_set += t_set;
    total_reg += t_reg;
  }

  free(cps);

  fprintf(stdout, "POS lead: %6.2lfmsec.  REG lead: %6.2lfmsec.\n",
          total_set * 1000.0, total_reg * 1000.0);
}